

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall
QComboBoxPrivate::initViewItemOption(QComboBoxPrivate *this,QStyleOptionViewItem *option)

{
  QWidget *this_00;
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  QAbstractItemView *pQVar4;
  long in_FS_OFFSET;
  undefined1 local_50 [8];
  QModelIndex local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  pQVar4 = QComboBox::view((QComboBox *)this_00);
  (**(code **)(*(long *)&(pQVar4->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x2f8))
            (pQVar4,option);
  option->widget = this_00;
  QPersistentModelIndex::operator_cast_to_QModelIndex
            ((QModelIndex *)(local_50 + 8),&this->currentIndex);
  (option->index).m.ptr = local_48.m.ptr;
  (option->index).r = local_48.r;
  (option->index).c = local_48.c;
  (option->index).i = local_48.i;
  QComboBox::currentText((QString *)(local_50 + 8),(QComboBox *)this_00);
  pDVar2 = (option->text).d.d;
  pcVar3 = (option->text).d.ptr;
  (option->text).d.d = (Data *)local_48._0_8_;
  (option->text).d.ptr = (char16_t *)local_48.i;
  qVar1 = (option->text).d.size;
  (option->text).d.size = (qsizetype)local_48.m.ptr;
  local_48._0_8_ = pDVar2;
  local_48.i = (quintptr)pcVar3;
  local_48.m.ptr = (QAbstractItemModel *)qVar1;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)(local_50 + 8));
  QPersistentModelIndex::operator_cast_to_QModelIndex
            ((QModelIndex *)(local_50 + 8),&this->currentIndex);
  itemIcon((QComboBoxPrivate *)local_50,(QModelIndex *)this);
  QIcon::operator=(&option->icon,(QIcon *)local_50);
  QIcon::~QIcon((QIcon *)local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivate::initViewItemOption(QStyleOptionViewItem *option) const
{
    Q_Q(const QComboBox);
    q->view()->initViewItemOption(option);
    option->widget = q;
    option->index = currentIndex;
    option->text = q->currentText();
    option->icon = itemIcon(currentIndex);
}